

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_byte(lua_State *L)

{
  int iVar1;
  int space;
  ulong in_RAX;
  char *pcVar2;
  lua_Integer def;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t l;
  ulong local_38;
  
  local_38 = in_RAX;
  pcVar2 = luaL_checklstring(L,1,&local_38);
  def = luaL_optinteger(L,2,1);
  if (def < 0) {
    if (local_38 < (ulong)-def) {
      def = 0;
    }
    else {
      def = def + local_38 + 1;
    }
  }
  uVar3 = luaL_optinteger(L,3,def);
  if ((long)uVar3 < 0) {
    if (local_38 < -uVar3) {
      uVar3 = 0;
    }
    else {
      uVar3 = uVar3 + local_38 + 1;
    }
  }
  lVar5 = 1;
  if (1 < def) {
    lVar5 = def;
  }
  uVar4 = local_38;
  if ((long)uVar3 < (long)local_38) {
    uVar4 = uVar3;
  }
  space = 0;
  if (lVar5 <= (long)uVar4) {
    if ((long)(uVar4 - lVar5) < 0x7fffffff) {
      iVar1 = (int)(uVar4 - lVar5);
      space = iVar1 + 1;
      luaL_checkstack(L,space,"string slice too long");
      if (-1 < iVar1) {
        uVar3 = 0;
        do {
          lua_pushinteger(L,(ulong)(byte)pcVar2[uVar3 + lVar5 + -1]);
          uVar3 = uVar3 + 1;
        } while (((int)uVar4 - (int)lVar5) + 1 != uVar3);
      }
    }
    else {
      space = luaL_error(L,"string slice too long");
    }
  }
  return space;
}

Assistant:

static int str_byte (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  lua_Integer posi = posrelat(luaL_optinteger(L, 2, 1), l);
  lua_Integer pose = posrelat(luaL_optinteger(L, 3, posi), l);
  int n, i;
  if (posi < 1) posi = 1;
  if (pose > (lua_Integer)l) pose = l;
  if (posi > pose) return 0;  /* empty interval; return no values */
  if (pose - posi >= INT_MAX)  /* arithmetic overflow? */
    return luaL_error(L, "string slice too long");
  n = (int)(pose -  posi) + 1;
  luaL_checkstack(L, n, "string slice too long");
  for (i=0; i<n; i++)
    lua_pushinteger(L, uchar(s[posi+i-1]));
  return n;
}